

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexHelper.cpp
# Opt level: O0

Var Js::RegexHelper::RegexEs5ReplaceImpl
              (ScriptContext *scriptContext,JavascriptRegExp *regularExpression,
              JavascriptString *input,RecyclableObject *replacefn)

{
  char16 c;
  code *pcVar1;
  long lVar2;
  int groupId_00;
  Var *lastSuccessfulMatch_00;
  Type nValue;
  undefined4 uVar3;
  uint inputLength_00;
  RegexPattern *function;
  JavascriptRegExp *pJVar4;
  bool bVar5;
  Var nonMatchValue_00;
  undefined4 *puVar6;
  JavascriptLibrary *pJVar7;
  JavascriptString *pJVar8;
  ThreadContext *pTVar9;
  RecyclableObject *pRVar10;
  uint *puVar11;
  Var pvVar12;
  CharCount CVar13;
  bool isGlobal_00;
  GroupInfo GStack_350;
  anon_class_24_3_7db8a28a aStack_348;
  JavascriptString *apJStack_330 [2];
  ScriptContext *local_320;
  JavascriptRegExp *local_318;
  JavascriptString *local_310;
  GroupInfo local_308;
  Var *local_300;
  JavascriptString *local_2f8;
  JavascriptString *replace;
  ushort local_2e8;
  undefined6 uStack_2e6;
  undefined8 *local_2e0;
  Var local_2d8;
  Var replaceVar;
  ThreadContext *threadContext;
  GroupInfo GStack_2c0;
  int groupId;
  undefined8 *local_2b8;
  Var *replaceArgs;
  GroupInfo lastSuccessfulMatch;
  GroupInfo lastActualMatch;
  Builder<256U> concatenated;
  CharCount offset;
  bool isSticky;
  bool isGlobal;
  RegexMatchState state;
  GroupInfo lastMatch;
  Var nonMatchValue;
  uint16 numGroups;
  char16 *pcStack_40;
  CharCount inputLength;
  char16 *inputStr;
  JavascriptString *newString;
  RegexPattern *pattern;
  RecyclableObject *replacefn_local;
  JavascriptString *input_local;
  JavascriptRegExp *regularExpression_local;
  ScriptContext *scriptContext_local;
  
  apJStack_330[0] = (JavascriptString *)0x1361294;
  pattern = (RegexPattern *)replacefn;
  replacefn_local = &input->super_RecyclableObject;
  input_local = (JavascriptString *)regularExpression;
  regularExpression_local = (JavascriptRegExp *)scriptContext;
  newString = (JavascriptString *)JavascriptRegExp::GetPattern(regularExpression);
  inputStr = (char16 *)0x0;
  apJStack_330[0] = (JavascriptString *)0x13612a9;
  pcStack_40 = JavascriptString::GetString((JavascriptString *)replacefn_local);
  apJStack_330[0] = (JavascriptString *)0x13612b6;
  nonMatchValue._4_4_ = JavascriptString::GetLength((JavascriptString *)replacefn_local);
  apJStack_330[0] = (JavascriptString *)0x13612c2;
  nonMatchValue._2_2_ = UnifiedRegex::RegexPattern::NumGroups((RegexPattern *)newString);
  apJStack_330[0] = (JavascriptString *)0x13612d1;
  nonMatchValue_00 = NonMatchValue((ScriptContext *)regularExpression_local,false);
  apJStack_330[0] = (JavascriptString *)0x13612de;
  UnifiedRegex::GroupInfo::GroupInfo((GroupInfo *)&state.matcher);
  if ((nonMatchValue._2_2_ == 0) || (0x7fff < nonMatchValue._2_2_)) {
    AssertCount = AssertCount + 1;
    apJStack_330[0] = (JavascriptString *)0x136130d;
    Throw::LogAssert();
    apJStack_330[0] = (JavascriptString *)0x136131d;
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    apJStack_330[0] = (JavascriptString *)0x1361342;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RegexHelper.cpp"
                                ,0x502,"(0 < numGroups && numGroups <= (32767))",
                                "0 < numGroups && numGroups <= (32767)");
    if (!bVar5) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    apJStack_330[0] = (JavascriptString *)0x1361358;
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  local_320 = (ScriptContext *)regularExpression_local;
  local_318 = (JavascriptRegExp *)input_local;
  local_310 = (JavascriptString *)replacefn_local;
  apJStack_330[0] = (JavascriptString *)0x136138a;
  pJVar7 = ScriptContext::GetLibrary((ScriptContext *)regularExpression_local);
  apJStack_330[0] = (JavascriptString *)0x1361399;
  pJVar8 = JavascriptLibrary::CreateStringFromCppLiteral<19ul>
                     (pJVar7,(char16 (*) [19])L"<replace function>");
  apJStack_330[0] = (JavascriptString *)0x13613bb;
  RegexHelperTrace(local_320,Replace,local_318,local_310,pJVar8);
  apJStack_330[0] = (JavascriptString *)0x13613d7;
  PrimBeginMatch((RegexMatchState *)&offset,(ScriptContext *)regularExpression_local,
                 (RegexPattern *)newString,pcStack_40,nonMatchValue._4_4_,false);
  apJStack_330[0] = (JavascriptString *)0x13613e0;
  concatenated._551_1_ = UnifiedRegex::RegexPattern::IsGlobal((RegexPattern *)newString);
  apJStack_330[0] = (JavascriptString *)0x13613ee;
  concatenated._550_1_ = UnifiedRegex::RegexPattern::IsSticky((RegexPattern *)newString);
  if ((concatenated._551_1_ & 1) != 0) {
    apJStack_330[0] = (JavascriptString *)0x1361404;
    JavascriptRegExp::SetLastIndex((JavascriptRegExp *)input_local,0);
  }
  concatenated.isFinalized = false;
  concatenated._545_3_ = 0;
  if (((concatenated._551_1_ & 1) == 0) && ((concatenated._550_1_ & 1) != 0)) {
    apJStack_330[0] = (JavascriptString *)0x1361420;
    concatenated._544_4_ = JavascriptRegExp::GetLastIndex((JavascriptRegExp *)input_local);
  }
  apJStack_330[0] = (JavascriptString *)0x1361433;
  CompoundString::Builder<256U>::Builder
            ((Builder<256U> *)&lastActualMatch,(ScriptContext *)regularExpression_local);
  apJStack_330[0] = (JavascriptString *)0x136143f;
  UnifiedRegex::GroupInfo::GroupInfo(&lastSuccessfulMatch);
  apJStack_330[0] = (JavascriptString *)0x136144b;
  UnifiedRegex::GroupInfo::GroupInfo((GroupInfo *)&replaceArgs);
  apJStack_330[0] = (JavascriptString *)0x1361454;
  pTVar9 = ScriptContext::GetThreadContext((ScriptContext *)regularExpression_local);
  apJStack_330[0] = (JavascriptString *)0x1361470;
  ThreadContext::ProbeStackNoDispose
            (pTVar9,(ulong)nonMatchValue._2_2_ * 8 + 0x18,(ScriptContext *)regularExpression_local,
             (PVOID)0x0);
  pJVar4 = regularExpression_local;
  lVar2 = -(ulong)((uint)nonMatchValue._2_2_ * 8 + 0x27 & 0xfffffff0);
  local_2b8 = (undefined8 *)((long)apJStack_330 + lVar2 + 8);
  *(undefined8 *)((long)apJStack_330 + lVar2) = 0x136149b;
  pJVar7 = ScriptContext::GetLibrary((ScriptContext *)pJVar4);
  *(undefined8 *)((long)apJStack_330 + lVar2) = 0x13614a3;
  pRVar10 = JavascriptLibraryBase::GetUndefined(&pJVar7->super_JavascriptLibraryBase);
  *local_2b8 = pRVar10;
  local_2b8[(int)(nonMatchValue._2_2_ + 2)] = replacefn_local;
  if (concatenated._544_4_ != 0) {
    apJStack_330[1] = (JavascriptString *)replacefn_local;
    *(undefined8 *)((long)apJStack_330 + lVar2) = 0x13614e7;
    puVar11 = min<unsigned_int>((uint *)&concatenated.isFinalized,(uint *)((long)&nonMatchValue + 4)
                               );
    pJVar8 = apJStack_330[1];
    CVar13 = *puVar11;
    *(undefined8 *)((long)apJStack_330 + lVar2) = 0x13614fe;
    CompoundString::Builder<256U>::Append((Builder<256U> *)&lastActualMatch,pJVar8,0,CVar13);
  }
  do {
    pJVar4 = regularExpression_local;
    pJVar8 = newString;
    inputLength_00 = nonMatchValue._4_4_;
    uVar3 = concatenated._544_4_;
    if (nonMatchValue._4_4_ < (uint)concatenated._544_4_) {
      *(undefined8 *)((long)apJStack_330 + lVar2) = 0x1361514;
      UnifiedRegex::GroupInfo::Reset(&lastSuccessfulMatch);
      break;
    }
    *(undefined8 *)((long)apJStack_330 + lVar2) = 0x1361531;
    GStack_2c0 = PrimMatch((RegexMatchState *)&offset,(ScriptContext *)pJVar4,(RegexPattern *)pJVar8
                           ,inputLength_00,uVar3);
    lastSuccessfulMatch = GStack_2c0;
    *(undefined8 *)((long)apJStack_330 + lVar2) = 0x1361552;
    bVar5 = UnifiedRegex::GroupInfo::IsUndefined(&lastSuccessfulMatch);
    if (bVar5) break;
    replaceArgs = (Var *)lastSuccessfulMatch;
    for (threadContext._4_4_ = 0; pJVar4 = regularExpression_local, pRVar10 = replacefn_local,
        pJVar8 = newString, groupId_00 = threadContext._4_4_,
        threadContext._4_4_ < (int)(uint)nonMatchValue._2_2_;
        threadContext._4_4_ = threadContext._4_4_ + 1) {
      *(undefined8 *)((long)apJStack_330 + lVar2) = 0x136159f;
      pvVar12 = GetGroup((ScriptContext *)pJVar4,(RegexPattern *)pJVar8,(JavascriptString *)pRVar10,
                         nonMatchValue_00,groupId_00);
      local_2b8[threadContext._4_4_ + 1] = pvVar12;
    }
    nValue = lastSuccessfulMatch.offset;
    *(undefined8 *)((long)apJStack_330 + lVar2) = 0x13615d9;
    pvVar12 = JavascriptNumber::ToVar(nValue,(ScriptContext *)pJVar4);
    pJVar4 = regularExpression_local;
    local_2b8[(int)(nonMatchValue._2_2_ + 1)] = pvVar12;
    *(undefined8 *)((long)apJStack_330 + lVar2) = 0x13615fa;
    pTVar9 = ScriptContext::GetThreadContext((ScriptContext *)pJVar4);
    function = pattern;
    replaceVar = pTVar9;
    replace = (JavascriptString *)pattern;
    local_2e8 = nonMatchValue._2_2_;
    local_2e0 = local_2b8;
    *(RegexPattern **)((long)&aStack_348 + lVar2) = pattern;
    *(ulong *)((long)apJStack_330 + lVar2 + -0x10) = CONCAT62(uStack_2e6,local_2e8);
    *(undefined8 **)((long)apJStack_330 + lVar2 + -8) = local_2e0;
    *(undefined8 *)((long)&GStack_350 + lVar2) = 0x136165e;
    pvVar12 = ThreadContext::
              ExecuteImplicitCall<Js::RegexHelper::RegexEs5ReplaceImpl(Js::ScriptContext*,Js::JavascriptRegExp*,Js::JavascriptString*,Js::RecyclableObject*)::__0>
                        (pTVar9,(RecyclableObject *)function,ImplicitCall_Accessor,
                         *(anon_class_24_3_7db8a28a *)((long)&aStack_348 + lVar2));
    pJVar4 = regularExpression_local;
    local_2d8 = pvVar12;
    *(undefined8 *)((long)apJStack_330 + lVar2) = 0x1361679;
    local_2f8 = JavascriptConversion::ToString(pvVar12,(ScriptContext *)pJVar4);
    pRVar10 = replacefn_local;
    uVar3 = concatenated._544_4_;
    CVar13 = lastSuccessfulMatch.offset - concatenated._544_4_;
    *(undefined8 *)((long)apJStack_330 + lVar2) = 0x136169c;
    CompoundString::Builder<256U>::Append
              ((Builder<256U> *)&lastActualMatch,(JavascriptString *)pRVar10,uVar3,CVar13);
    pJVar8 = local_2f8;
    *(undefined8 *)((long)apJStack_330 + lVar2) = 0x13616af;
    CompoundString::Builder<256U>::Append((Builder<256U> *)&lastActualMatch,pJVar8);
    if (lastSuccessfulMatch.length == 0) {
      if (lastSuccessfulMatch.offset < nonMatchValue._4_4_) {
        c = pcStack_40[(ulong)lastSuccessfulMatch & 0xffffffff];
        *(undefined8 *)((long)apJStack_330 + lVar2) = 0x13616dd;
        CompoundString::Builder<256U>::Append((Builder<256U> *)&lastActualMatch,c);
      }
      concatenated._544_4_ = lastSuccessfulMatch.offset + 1;
    }
    else {
      *(undefined8 *)((long)apJStack_330 + lVar2) = 0x13616f7;
      concatenated._544_4_ = UnifiedRegex::GroupInfo::EndOffset(&lastSuccessfulMatch);
    }
  } while ((concatenated._551_1_ & 1) != 0);
  pJVar4 = regularExpression_local;
  pJVar8 = newString;
  *(undefined8 *)((long)apJStack_330 + lVar2) = 0x1361717;
  PrimEndMatch((RegexMatchState *)&offset,(ScriptContext *)pJVar4,(RegexPattern *)pJVar8);
  pRVar10 = replacefn_local;
  uVar3 = concatenated._544_4_;
  if (concatenated._544_4_ == 0) {
    inputStr = (char16 *)replacefn_local;
  }
  else {
    if ((uint)concatenated._544_4_ < nonMatchValue._4_4_) {
      CVar13 = nonMatchValue._4_4_ - concatenated._544_4_;
      *(undefined8 *)((long)apJStack_330 + lVar2) = 0x1361748;
      CompoundString::Builder<256U>::Append
                ((Builder<256U> *)&lastActualMatch,(JavascriptString *)pRVar10,uVar3,CVar13);
    }
    *(undefined8 *)((long)apJStack_330 + lVar2) = 0x1361754;
    inputStr = (char16 *)CompoundString::Builder<256U>::ToString((Builder<256U> *)&lastActualMatch);
  }
  pJVar4 = regularExpression_local;
  pJVar8 = input_local;
  pRVar10 = replacefn_local;
  lastSuccessfulMatch_00 = replaceArgs;
  local_300 = replaceArgs;
  local_308 = lastSuccessfulMatch;
  isGlobal_00 = (bool)(concatenated._551_1_ & 1);
  bVar5 = (bool)(concatenated._550_1_ & 1);
  *(GroupInfo *)((long)&aStack_348 + lVar2) = lastSuccessfulMatch;
  *(undefined4 *)((long)apJStack_330 + lVar2 + -0x10) = 1;
  *(undefined4 *)((long)apJStack_330 + lVar2 + -8) = 1;
  *(undefined4 *)((long)apJStack_330 + lVar2) = 0;
  *(undefined8 *)((long)&GStack_350 + lVar2) = 0x13617cb;
  PropagateLastMatch((ScriptContext *)pJVar4,isGlobal_00,bVar5,(JavascriptRegExp *)pJVar8,
                     (JavascriptString *)pRVar10,(GroupInfo)lastSuccessfulMatch_00,
                     *(GroupInfo *)((long)&aStack_348 + lVar2),
                     *(bool *)((long)apJStack_330 + lVar2 + -0x10),
                     *(bool *)((long)apJStack_330 + lVar2 + -8),
                     *(bool *)((long)apJStack_330 + lVar2));
  return inputStr;
}

Assistant:

Var RegexHelper::RegexEs5ReplaceImpl(ScriptContext* scriptContext, JavascriptRegExp* regularExpression, JavascriptString* input, RecyclableObject* replacefn)
    {
        UnifiedRegex::RegexPattern* pattern = regularExpression->GetPattern();
        JavascriptString* newString = nullptr;
        const char16* inputStr = input->GetString();
        CharCount inputLength = input->GetLength();
        const uint16 numGroups = pattern->NumGroups();
        Var nonMatchValue = NonMatchValue(scriptContext, false);
        UnifiedRegex::GroupInfo lastMatch; // initially undefined

        // Regex parser should ensure this condition holds, but let's be doubly sure.
        // numGroups is always positive because the entire regex counts as a capturing group.
        AssertOrFailFast(0 < numGroups && numGroups <= INT16_MAX);

#if ENABLE_REGEX_CONFIG_OPTIONS
        RegexHelperTrace(scriptContext, UnifiedRegex::RegexStats::Replace, regularExpression, input, scriptContext->GetLibrary()->CreateStringFromCppLiteral(_u("<replace function>")));
#endif

        RegexMatchState state;
        PrimBeginMatch(state, scriptContext, pattern, inputStr, inputLength, false);

        // NOTE: These must be kept out of the scope of the try below!
        const bool isGlobal = pattern->IsGlobal();
        const bool isSticky = pattern->IsSticky();

        // If global = true, set lastIndex to 0 in case it is used in replacefn
        if (isGlobal)
        {
            regularExpression->SetLastIndex(0);
        }

        // If global = false and sticky = true, set offset = lastIndex, else set offset = 0
        CharCount offset = 0;
        if (!isGlobal && isSticky)
        {
            offset = regularExpression->GetLastIndex();
        }

        CompoundString::Builder<64 * sizeof(void *) / sizeof(char16)> concatenated(scriptContext);
        UnifiedRegex::GroupInfo lastActualMatch;
        UnifiedRegex::GroupInfo lastSuccessfulMatch;

        // Replace function must be called with arguments (<function's this>, group0, ..., groupn, offset, input)
        // The garbage collector must know about this array since it is being passed back into script land
        Var* replaceArgs;
        PROBE_STACK_NO_DISPOSE(scriptContext, (numGroups + 3) * sizeof(Var));
        replaceArgs = (Var*)_alloca((numGroups + 3) * sizeof(Var));
        replaceArgs[0] = scriptContext->GetLibrary()->GetUndefined();
        replaceArgs[numGroups + 2] = input;

        if (offset > 0)
        {
            concatenated.Append(input, 0, min(offset, inputLength));
        }

        do
        {
            if (offset > inputLength)
            {
                lastActualMatch.Reset();
                break;
            }

            lastActualMatch = PrimMatch(state, scriptContext, pattern, inputLength, offset);

            if (lastActualMatch.IsUndefined())
                break;

            lastSuccessfulMatch = lastActualMatch;
            for (int groupId = 0;  groupId < numGroups; groupId++)
                replaceArgs[groupId + 1] = GetGroup(scriptContext, pattern, input, nonMatchValue, groupId);
            replaceArgs[numGroups + 1] = JavascriptNumber::ToVar(lastActualMatch.offset, scriptContext);

            // The called function must see the global state updated by the current match
            // (Should the function reach into a RegExp field, the pattern will still be valid, thus there's no
            //  danger of the primitive regex matcher being re-entered)

            // WARNING: We go off into script land here, which way in turn invoke a regex operation, even on the
            //          same regex.

            ThreadContext* threadContext = scriptContext->GetThreadContext();
            Var replaceVar = threadContext->ExecuteImplicitCall(replacefn, ImplicitCall_Accessor, [=]()->Js::Var
            {
                    return JavascriptFunction::CallFunction<true>(replacefn, replacefn->GetEntryPoint(), Arguments(CallInfo(UInt16Math::Add(numGroups, 3)), replaceArgs));
            });
            JavascriptString* replace = JavascriptConversion::ToString(replaceVar, scriptContext);
            concatenated.Append(input, offset, lastActualMatch.offset - offset);
            concatenated.Append(replace);

            if (lastActualMatch.length == 0)
            {
                if (lastActualMatch.offset < inputLength)
                {
                    concatenated.Append(inputStr[lastActualMatch.offset]);
                }
                offset = lastActualMatch.offset + 1;
            }
            else
            {
                offset = lastActualMatch.EndOffset();
            }
        }
        while (isGlobal);

        PrimEndMatch(state, scriptContext, pattern);

        if (offset == 0)
        {
            // There was no successful match so the result is the input string.
            newString = input;
        }
        else
        {
            if (offset < inputLength)
            {
                concatenated.Append(input, offset, inputLength - offset);
            }
            newString = concatenated.ToString();
        }

        PropagateLastMatch(scriptContext, isGlobal, isSticky, regularExpression, input, lastSuccessfulMatch, lastActualMatch, true, true);
        return newString;
    }